

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract_avx2.c
# Opt level: O2

void aom_subtract_block_avx2
               (int rows,int cols,int16_t *diff_ptr,ptrdiff_t diff_stride,uint8_t *src_ptr,
               ptrdiff_t src_stride,uint8_t *pred_ptr,ptrdiff_t pred_stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  undefined4 in_register_00000034;
  undefined4 in_register_0000003c;
  uint8_t *pred_ptr_00;
  uint8_t *src_ptr_00;
  bool bVar6;
  
  switch(cols << 0x1c | cols - 0x10U >> 4) {
  case 0:
    iVar5 = 0;
    if (0 < rows) {
      iVar5 = rows;
    }
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      auVar1 = vlddqu_avx(*(undefined1 (*) [16])src_ptr);
      auVar2 = vlddqu_avx(*(undefined1 (*) [16])pred_ptr);
      auVar3 = vpmovzxbw_avx2(auVar1);
      auVar4 = vpmovzxbw_avx2(auVar2);
      auVar3 = vpsubw_avx2(auVar3,auVar4);
      *(undefined1 (*) [32])diff_ptr = auVar3;
      src_ptr = *(undefined1 (*) [16])src_ptr + src_stride;
      pred_ptr = *(undefined1 (*) [16])pred_ptr + pred_stride;
      diff_ptr = (int16_t *)(*(undefined1 (*) [32])diff_ptr + diff_stride * 2);
    }
    break;
  case 1:
    iVar5 = 0;
    if (0 < rows) {
      iVar5 = rows;
    }
    while (iVar5 != 0) {
      subtract32_avx2(diff_ptr,src_ptr,pred_ptr);
      src_ptr = src_ptr + src_stride;
      pred_ptr = pred_ptr + pred_stride;
      diff_ptr = diff_ptr + diff_stride;
      iVar5 = iVar5 + -1;
    }
    break;
  default:
    aom_subtract_block_sse2
              (CONCAT44(in_register_0000003c,rows),CONCAT44(in_register_00000034,cols),diff_ptr,
               diff_stride,src_ptr,src_stride);
    return;
  case 3:
    iVar5 = 0;
    if (0 < rows) {
      iVar5 = rows;
    }
    while (iVar5 != 0) {
      subtract32_avx2(diff_ptr,src_ptr,pred_ptr);
      subtract32_avx2(diff_ptr + 0x20,src_ptr + 0x20,pred_ptr + 0x20);
      src_ptr = src_ptr + src_stride;
      pred_ptr = pred_ptr + pred_stride;
      diff_ptr = diff_ptr + diff_stride;
      iVar5 = iVar5 + -1;
    }
    break;
  case 7:
    iVar5 = 0;
    if (0 < rows) {
      iVar5 = rows;
    }
    src_ptr_00 = src_ptr + 0x60;
    pred_ptr_00 = pred_ptr + 0x60;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      subtract32_avx2(diff_ptr,src_ptr_00 + -0x60,pred_ptr_00 + -0x60);
      subtract32_avx2(diff_ptr + 0x20,src_ptr_00 + -0x40,pred_ptr_00 + -0x40);
      subtract32_avx2(diff_ptr + 0x40,src_ptr_00 + -0x20,pred_ptr_00 + -0x20);
      subtract32_avx2(diff_ptr + 0x60,src_ptr_00,pred_ptr_00);
      src_ptr_00 = src_ptr_00 + src_stride;
      pred_ptr_00 = pred_ptr_00 + pred_stride;
      diff_ptr = diff_ptr + diff_stride;
    }
  }
  return;
}

Assistant:

void aom_subtract_block_avx2(int rows, int cols, int16_t *diff_ptr,
                             ptrdiff_t diff_stride, const uint8_t *src_ptr,
                             ptrdiff_t src_stride, const uint8_t *pred_ptr,
                             ptrdiff_t pred_stride) {
  switch (cols) {
    case 16:
      subtract_block_16xn_avx2(rows, diff_ptr, diff_stride, src_ptr, src_stride,
                               pred_ptr, pred_stride);
      break;
    case 32:
      subtract_block_32xn_avx2(rows, diff_ptr, diff_stride, src_ptr, src_stride,
                               pred_ptr, pred_stride);
      break;
    case 64:
      subtract_block_64xn_avx2(rows, diff_ptr, diff_stride, src_ptr, src_stride,
                               pred_ptr, pred_stride);
      break;
    case 128:
      subtract_block_128xn_avx2(rows, diff_ptr, diff_stride, src_ptr,
                                src_stride, pred_ptr, pred_stride);
      break;
    default:
      aom_subtract_block_sse2(rows, cols, diff_ptr, diff_stride, src_ptr,
                              src_stride, pred_ptr, pred_stride);
      break;
  }
}